

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<double> * __thiscall
Imath_3_2::Matrix44<double>::scale<double>(Matrix44<double> *this,Vec3<double> *s)

{
  Vec3<double> *s_local;
  Matrix44<double> *this_local;
  
  this->x[0][0] = s->x * this->x[0][0];
  this->x[0][1] = s->x * this->x[0][1];
  this->x[0][2] = s->x * this->x[0][2];
  this->x[0][3] = s->x * this->x[0][3];
  this->x[1][0] = s->y * this->x[1][0];
  this->x[1][1] = s->y * this->x[1][1];
  this->x[1][2] = s->y * this->x[1][2];
  this->x[1][3] = s->y * this->x[1][3];
  this->x[2][0] = s->z * this->x[2][0];
  this->x[2][1] = s->z * this->x[2][1];
  this->x[2][2] = s->z * this->x[2][2];
  this->x[2][3] = s->z * this->x[2][3];
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::scale (const Vec3<S>& s) IMATH_NOEXCEPT
{
    x[0][0] *= s.x;
    x[0][1] *= s.x;
    x[0][2] *= s.x;
    x[0][3] *= s.x;

    x[1][0] *= s.y;
    x[1][1] *= s.y;
    x[1][2] *= s.y;
    x[1][3] *= s.y;

    x[2][0] *= s.z;
    x[2][1] *= s.z;
    x[2][2] *= s.z;
    x[2][3] *= s.z;

    return *this;
}